

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  int iVar1;
  int iVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  puVar3 = (ulong *)XAllocSizeHints();
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (window->resizable == 0) {
      lVar4 = 0x1c;
      lVar5 = 0x24;
      lVar6 = 0x18;
      lVar7 = 0x20;
      uVar8 = 0x30;
    }
    else {
      iVar1 = window->minwidth;
      if ((iVar1 != -1) && (iVar2 = window->minheight, iVar2 != -1)) {
        *(byte *)puVar3 = (byte)*puVar3 | 0x10;
        *(int *)(puVar3 + 3) = iVar1;
        *(int *)((long)puVar3 + 0x1c) = iVar2;
      }
      iVar1 = window->maxwidth;
      if ((iVar1 != -1) && (iVar2 = window->maxheight, iVar2 != -1)) {
        *(byte *)puVar3 = (byte)*puVar3 | 0x20;
        *(int *)(puVar3 + 4) = iVar1;
        *(int *)((long)puVar3 + 0x24) = iVar2;
      }
      width = window->numer;
      if ((width == -1) || (height = window->denom, height == -1)) goto LAB_001148ac;
      lVar4 = 0x34;
      lVar5 = 0x3c;
      lVar6 = 0x30;
      lVar7 = 0x38;
      uVar8 = 0x80;
    }
    *puVar3 = *puVar3 | uVar8;
    *(int *)((long)puVar3 + lVar7) = width;
    *(int *)((long)puVar3 + lVar6) = width;
    *(int *)((long)puVar3 + lVar5) = height;
    *(int *)((long)puVar3 + lVar4) = height;
  }
LAB_001148ac:
  *(byte *)((long)puVar3 + 1) = *(byte *)((long)puVar3 + 1) | 2;
  *(undefined4 *)(puVar3 + 9) = 10;
  XSetWMNormalHints(_glfw.x11.display,(window->x11).handle,puVar3);
  XFree(puVar3);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    hints->flags |= PWinGravity;
    hints->win_gravity = StaticGravity;

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}